

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<chaiscript::dispatch::Dynamic_Object>::
handle<chaiscript::dispatch::Dynamic_Object,void>
          (Handle_Return<chaiscript::dispatch::Dynamic_Object> *this,Dynamic_Object *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  undefined1 local_28 [24];
  Dynamic_Object *r_local;
  
  local_28._16_8_ = r;
  r_local = (Dynamic_Object *)this;
  std::make_shared<chaiscript::dispatch::Dynamic_Object,chaiscript::dispatch::Dynamic_Object>
            ((Dynamic_Object *)local_28);
  Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::dispatch::Dynamic_Object>,void>
            ((Boxed_Value *)this,(shared_ptr<chaiscript::dispatch::Dynamic_Object> *)local_28,true);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Dynamic_Object>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Dynamic_Object> *)local_28);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }